

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_decoder_init_file(char *pFilePath,ma_decoder_config *pConfig,ma_decoder *pDecoder)

{
  _func_void_void_ptr_ma_data_source_ptr_ma_allocation_callbacks_ptr *p_Var1;
  ma_result mVar2;
  ma_bool32 mVar3;
  ulong uVar4;
  ma_decoder_config config;
  ma_decoder_config config_1;
  
  if (pConfig == (ma_decoder_config *)0x0) {
    memset(&config_1,0,0x90);
  }
  else {
    memcpy(&config_1,pConfig,0x90);
  }
  memcpy(&config,&config_1,0x90);
  mVar2 = ma_decoder__preinit((ma_decoder_read_proc)0x0,(ma_decoder_seek_proc)0x0,
                              (ma_decoder_tell_proc)0x0,(void *)0x0,&config,pDecoder);
  if (mVar2 != MA_SUCCESS) {
    return mVar2;
  }
  if (pFilePath == (char *)0x0) {
    return MA_INVALID_ARGS;
  }
  if (*pFilePath == '\0') {
    return MA_INVALID_ARGS;
  }
  if (config.encodingFormat != ma_encoding_format_unknown) {
    mVar2 = MA_NO_BACKEND;
    if (config.encodingFormat == ma_encoding_format_wav) {
      mVar2 = ma_decoder_init_wav_from_file__internal(pFilePath,&config,pDecoder);
    }
    if (config.encodingFormat == ma_encoding_format_flac) {
      mVar2 = ma_decoder_init_flac_from_file__internal(pFilePath,&config,pDecoder);
    }
    if (config.encodingFormat == ma_encoding_format_mp3) {
      mVar2 = ma_decoder_init_mp3_from_file__internal(pFilePath,&config,pDecoder);
    }
    if (config.encodingFormat == ma_encoding_format_vorbis) {
      mVar2 = ma_decoder_init_vorbis_from_file__internal(pFilePath,&config,pDecoder);
    }
    if (mVar2 == MA_SUCCESS) goto LAB_0016a33f;
  }
  if (config.ppCustomBackendVTables != (ma_decoding_backend_vtable **)0x0) {
    for (uVar4 = 0; uVar4 < config.customBackendCount; uVar4 = uVar4 + 1) {
      if ((config.ppCustomBackendVTables[uVar4] != (ma_decoding_backend_vtable *)0x0) &&
         (mVar2 = ma_decoder_init_from_file__internal
                            (config.ppCustomBackendVTables[uVar4],config.pCustomBackendUserData,
                             pFilePath,&config,pDecoder), mVar2 == MA_SUCCESS)) goto LAB_0016a33f;
    }
  }
  if (config.encodingFormat != ma_encoding_format_unknown) {
    return MA_NO_BACKEND;
  }
  mVar3 = ma_path_extension_equal(pFilePath,"wav");
  if ((((mVar3 == 0) ||
       (mVar2 = ma_decoder_init_wav_from_file__internal(pFilePath,&config,pDecoder),
       mVar2 != MA_SUCCESS)) &&
      ((mVar3 = ma_path_extension_equal(pFilePath,"flac"), mVar3 == 0 ||
       (mVar2 = ma_decoder_init_flac_from_file__internal(pFilePath,&config,pDecoder),
       mVar2 != MA_SUCCESS)))) &&
     ((((mVar3 = ma_path_extension_equal(pFilePath,"mp3"), mVar3 == 0 ||
        (mVar2 = ma_decoder_init_mp3_from_file__internal(pFilePath,&config,pDecoder),
        mVar2 != MA_SUCCESS)) &&
       ((mVar3 = ma_path_extension_equal(pFilePath,"ogg"), mVar3 == 0 ||
        (mVar2 = ma_decoder_init_vorbis_from_file__internal(pFilePath,&config,pDecoder),
        mVar2 != MA_SUCCESS)))) &&
      ((((mVar2 = ma_decoder_init_wav_from_file__internal(pFilePath,&config,pDecoder),
         mVar2 != MA_SUCCESS &&
         (mVar2 = ma_decoder_init_flac_from_file__internal(pFilePath,&config,pDecoder),
         mVar2 != MA_SUCCESS)) &&
        (mVar2 = ma_decoder_init_mp3_from_file__internal(pFilePath,&config,pDecoder),
        mVar2 != MA_SUCCESS)) &&
       (mVar2 = ma_decoder_init_vorbis_from_file__internal(pFilePath,&config,pDecoder),
       mVar2 != MA_SUCCESS)))))) {
    mVar2 = ma_decoder_init_vfs((ma_vfs *)0x0,pFilePath,pConfig,pDecoder);
    if (mVar2 == MA_SUCCESS) {
      return MA_SUCCESS;
    }
    return mVar2;
  }
LAB_0016a33f:
  mVar2 = ma_decoder__postinit(&config,pDecoder);
  if (mVar2 == MA_SUCCESS) {
    return MA_SUCCESS;
  }
  if (pDecoder->pBackendVTable != (ma_decoding_backend_vtable *)0x0) {
    p_Var1 = pDecoder->pBackendVTable->onUninit;
    if (p_Var1 != (_func_void_void_ptr_ma_data_source_ptr_ma_allocation_callbacks_ptr *)0x0) {
      (*p_Var1)(pDecoder->pBackendUserData,&pDecoder->pBackend,&pDecoder->allocationCallbacks);
      return mVar2;
    }
    return mVar2;
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_decoder_init_file(const char* pFilePath, const ma_decoder_config* pConfig, ma_decoder* pDecoder)
{
    ma_result result;
    ma_decoder_config config;

    config = ma_decoder_config_init_copy(pConfig);
    result = ma_decoder__preinit_file(pFilePath, &config, pDecoder);
    if (result != MA_SUCCESS) {
        return result;
    }

    /* If the backend has support for loading from a file path we'll want to use that. If that all fails we'll fall back to the VFS path. */
    result = MA_NO_BACKEND;

    if (config.encodingFormat != ma_encoding_format_unknown) {
    #ifdef MA_HAS_WAV
        if (config.encodingFormat == ma_encoding_format_wav) {
            result = ma_decoder_init_wav_from_file__internal(pFilePath, &config, pDecoder);
        }
    #endif
    #ifdef MA_HAS_FLAC
        if (config.encodingFormat == ma_encoding_format_flac) {
            result = ma_decoder_init_flac_from_file__internal(pFilePath, &config, pDecoder);
        }
    #endif
    #ifdef MA_HAS_MP3
        if (config.encodingFormat == ma_encoding_format_mp3) {
            result = ma_decoder_init_mp3_from_file__internal(pFilePath, &config, pDecoder);
        }
    #endif
    #ifdef MA_HAS_VORBIS
        if (config.encodingFormat == ma_encoding_format_vorbis) {
            result = ma_decoder_init_vorbis_from_file__internal(pFilePath, &config, pDecoder);
        }
    #endif
    }

    if (result != MA_SUCCESS) {
        /* Getting here means we weren't able to initialize a decoder of a specific encoding format. */

        /*
        We use trial and error to open a decoder. We prioritize custom decoders so that if they
        implement the same encoding format they take priority over the built-in decoders.
        */
        result = ma_decoder_init_custom_from_file__internal(pFilePath, &config, pDecoder);

        /*
        If we get to this point and we still haven't found a decoder, and the caller has requested a
        specific encoding format, there's no hope for it. Abort.
        */
        if (result != MA_SUCCESS && config.encodingFormat != ma_encoding_format_unknown) {
            return MA_NO_BACKEND;
        }

        /* First try loading based on the file extension so we don't waste time opening and closing files. */
    #ifdef MA_HAS_WAV
        if (result != MA_SUCCESS && ma_path_extension_equal(pFilePath, "wav")) {
            result = ma_decoder_init_wav_from_file__internal(pFilePath, &config, pDecoder);
        }
    #endif
    #ifdef MA_HAS_FLAC
        if (result != MA_SUCCESS && ma_path_extension_equal(pFilePath, "flac")) {
            result = ma_decoder_init_flac_from_file__internal(pFilePath, &config, pDecoder);
        }
    #endif
    #ifdef MA_HAS_MP3
        if (result != MA_SUCCESS && ma_path_extension_equal(pFilePath, "mp3")) {
            result = ma_decoder_init_mp3_from_file__internal(pFilePath, &config, pDecoder);
        }
    #endif
    #ifdef MA_HAS_VORBIS
        if (result != MA_SUCCESS && ma_path_extension_equal(pFilePath, "ogg")) {
            result = ma_decoder_init_vorbis_from_file__internal(pFilePath, &config, pDecoder);
        }
    #endif

        /*
        If we still haven't got a result just use trial and error. Custom decoders have already been attempted, so here we
        need only iterate over our stock decoders.
        */
        if (result != MA_SUCCESS) {
        #ifdef MA_HAS_WAV
            if (result != MA_SUCCESS) {
                result = ma_decoder_init_wav_from_file__internal(pFilePath, &config, pDecoder);
            }
        #endif
        #ifdef MA_HAS_FLAC
            if (result != MA_SUCCESS) {
                result = ma_decoder_init_flac_from_file__internal(pFilePath, &config, pDecoder);
            }
        #endif
        #ifdef MA_HAS_MP3
            if (result != MA_SUCCESS) {
                result = ma_decoder_init_mp3_from_file__internal(pFilePath, &config, pDecoder);
            }
        #endif
        #ifdef MA_HAS_VORBIS
            if (result != MA_SUCCESS) {
                result = ma_decoder_init_vorbis_from_file__internal(pFilePath, &config, pDecoder);
            }
        #endif
        }
    }

    /*
    If at this point we still haven't successfully initialized the decoder it most likely means
    the backend doesn't have an implementation for loading from a file path. We'll try using
    miniaudio's built-in file IO for loading file.
    */
    if (result == MA_SUCCESS) {
        /* Initialization was successful. Finish up. */
        result = ma_decoder__postinit(&config, pDecoder);
        if (result != MA_SUCCESS) {
            /*
            The backend was initialized successfully, but for some reason post-initialization failed. This is most likely
            due to an out of memory error. We're going to abort with an error here and not try to recover.
            */
            if (pDecoder->pBackendVTable != NULL && pDecoder->pBackendVTable->onUninit != NULL) {
                pDecoder->pBackendVTable->onUninit(pDecoder->pBackendUserData, &pDecoder->pBackend, &pDecoder->allocationCallbacks);
            }

            return result;
        }
    } else {
        /* Probably no implementation for loading from a file path. Use miniaudio's file IO instead. */
        result = ma_decoder_init_vfs(NULL, pFilePath, pConfig, pDecoder);
        if (result != MA_SUCCESS) {
            return result;
        }
    }

    return MA_SUCCESS;
}